

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_ManAssignCountNames(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_20;
  int local_1c;
  int Count;
  int iBox;
  int iObj;
  int i;
  Bac_Ntk_t *p_local;
  
  local_20 = 0;
  for (iBox = 0; iVar1 = Bac_NtkPiNum(p), iBox < iVar1; iBox = iBox + 1) {
    iVar1 = Bac_NtkPi(p,iBox);
    iVar2 = Bac_ObjBit(p,iVar1);
    if ((iVar2 == 0) && (iVar1 = Bac_ObjNameInt(p,iVar1), iVar1 == 0)) {
      local_20 = local_20 + 1;
    }
  }
  for (local_1c = 0; iVar1 = Bac_NtkObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Bac_ObjIsBox(p,local_1c);
    Count = local_1c;
    if (iVar1 != 0) {
      while( true ) {
        Count = Count + 1;
        iVar1 = Bac_NtkObjNum(p);
        bVar3 = false;
        if (Count < iVar1) {
          iVar1 = Bac_ObjIsBo(p,Count);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        iVar1 = Bac_ObjBit(p,Count);
        if ((iVar1 == 0) && (iVar1 = Bac_ObjNameInt(p,Count), iVar1 == 0)) {
          local_20 = local_20 + 1;
        }
      }
    }
  }
  return local_20;
}

Assistant:

int Bac_ManAssignCountNames( Bac_Ntk_t * p )
{
    int i, iObj, iBox, Count = 0;
    Bac_NtkForEachPiMain( p, iObj, i )
        if ( !Bac_ObjNameInt(p, iObj) )
            Count++;
    Bac_NtkForEachBox( p, iBox )
        Bac_BoxForEachBoMain( p, iBox, iObj, i )
            if ( !Bac_ObjNameInt(p, iObj) )
                Count++;
    return Count;
}